

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O1

void __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::BplusTree
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          string *str,uint cache_size)

{
  pointer pcVar1;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + str->_M_string_length);
  init(this,(EVP_PKEY_CTX *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

BplusTree(std::string str , unsigned int cache_size) {
            init(str , cache_size);
        }